

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O1

int __thiscall
FNodeBuilder::CloseSubsector
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          int subsector,vertex_t *outVerts)

{
  FPrivSeg *pFVar1;
  side_t **ppsVar2;
  sector_t **ppsVar3;
  uint uVar4;
  subsector_t *psVar5;
  USegPtr *pUVar6;
  FPrivVert *pFVar7;
  glseg_t *pgVar8;
  DWORD DVar9;
  uint uVar10;
  angle_t aVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  FPrivSeg *seg;
  vertex_t *pvVar15;
  vertex_t *pvVar16;
  seg_t *psVar17;
  ulong uVar18;
  uint uVar19;
  FPrivSeg *pFVar20;
  FPrivSeg *pFVar21;
  bool bVar22;
  uint uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  FPrivSeg *prev;
  int local_80;
  FPrivSeg *local_78;
  angle_t local_6c;
  vertex_t *local_68;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *local_60;
  uint local_54;
  int local_50;
  int local_4c;
  long local_48;
  vertex_t *local_40;
  seg_t *local_38;
  
  psVar5 = (this->Subsectors).Array;
  pFVar20 = (this->Segs).Array;
  psVar17 = psVar5[subsector].firstline;
  uVar10 = psVar5[subsector].numlines;
  uVar19 = uVar10 + (uint)psVar17;
  pUVar6 = (this->SegList).Array;
  uVar23 = pUVar6[(ulong)psVar17 & 0xffffffff].SegNum;
  seg = pFVar20 + uVar23;
  if ((uint)psVar17 < uVar19) {
    pFVar7 = (this->Vertices).Array;
    uVar18 = (ulong)psVar17 & 0xffffffff;
    dVar25 = 0.0;
    bVar22 = false;
    dVar24 = 0.0;
    do {
      uVar4 = pUVar6[uVar18].SegNum;
      dVar25 = dVar25 + (double)pFVar7[pFVar20[uVar4].v2].super_FSimpleVert.x +
                        (double)pFVar7[pFVar20[uVar4].v1].super_FSimpleVert.x;
      dVar24 = dVar24 + (double)pFVar7[pFVar20[uVar4].v2].super_FSimpleVert.y +
                        (double)pFVar7[pFVar20[uVar4].v1].super_FSimpleVert.y;
      if (pFVar20[uVar23].planenum != pFVar20[uVar4].planenum) {
        bVar22 = true;
      }
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  else {
    dVar24 = 0.0;
    bVar22 = false;
    dVar25 = 0.0;
  }
  dVar26 = (double)uVar10;
  local_4c = (int)((dVar25 / dVar26) * 0.5);
  local_50 = (int)((dVar24 / dVar26) * 0.5);
  pFVar7 = (this->Vertices).Array;
  local_68 = outVerts;
  local_60 = segs;
  local_6c = PointToAngle(pFVar7[seg->v1].super_FSimpleVert.x - local_4c,
                          pFVar7[seg->v1].super_FSimpleVert.y - local_50);
  DVar9 = PushGLSeg(this,segs,seg,outVerts);
  seg->storedseg = DVar9;
  local_48 = (long)seg->v1;
  if (bVar22) {
    local_80 = 1;
    uVar18 = (ulong)psVar17 & 0xffffffff;
    local_38 = psVar17;
    do {
      uVar10 = (int)uVar18 + 1;
      local_78 = seg;
      if (uVar19 <= uVar10) break;
      uVar23 = 0xffffffff;
      psVar17 = local_38;
      pFVar20 = (FPrivSeg *)0x0;
      local_54 = uVar10;
      do {
        pFVar7 = (this->Vertices).Array;
        pFVar1 = (this->Segs).Array + (this->SegList).Array[(ulong)psVar17 & 0xffffffff].SegNum;
        aVar11 = PointToAngle(pFVar7[pFVar1->v1].super_FSimpleVert.x - local_4c,
                              pFVar7[pFVar1->v1].super_FSimpleVert.y - local_50);
        segs = local_60;
        pvVar16 = local_68;
        uVar10 = local_6c - aVar11;
        iVar12 = seg->v2;
        pFVar21 = pFVar1;
        if ((pFVar1->v1 != iVar12) && (uVar23 <= uVar10 || uVar10 == 0)) {
          pFVar21 = pFVar20;
          uVar10 = uVar23;
        }
        uVar23 = uVar10;
        uVar10 = (int)psVar17 + 1;
        psVar17 = (seg_t *)(ulong)uVar10;
      } while ((uVar10 < uVar19) && (pFVar20 = pFVar21, pFVar1->v1 != iVar12));
      seg = pFVar1;
      if (pFVar21 != (FPrivSeg *)0x0) {
        seg = pFVar21;
      }
      if (iVar12 != seg->v1) {
        local_40 = local_68 + iVar12;
        pvVar15 = local_68 + seg->v1;
        TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(local_60,1);
        pgVar8 = segs->Array;
        uVar10 = segs->Count;
        pgVar8[uVar10].super_seg_t.v1 = local_40;
        pgVar8[uVar10].super_seg_t.v2 = pvVar15;
        ppsVar2 = &pgVar8[uVar10].super_seg_t.sidedef;
        *ppsVar2 = (side_t *)0x0;
        ppsVar2[1] = (side_t *)0x0;
        ppsVar3 = &pgVar8[uVar10].super_seg_t.frontsector;
        *ppsVar3 = (sector_t *)0x0;
        ppsVar3[1] = (sector_t *)0x0;
        pgVar8[uVar10].Partner = 0xffffffff;
        segs->Count = segs->Count + 1;
        local_80 = local_80 + 1;
      }
      local_6c = local_6c - uVar23;
      DVar9 = PushGLSeg(this,segs,seg,pvVar16);
      seg->storedseg = DVar9;
      local_80 = local_80 + 1;
      uVar18 = (ulong)local_54;
      local_78 = seg;
    } while (seg->v2 != (int)local_48);
  }
  else {
    local_78 = seg;
    iVar12 = OutputDegenerateSubsector(this,segs,subsector,true,0.0,&local_78,outVerts);
    iVar13 = OutputDegenerateSubsector
                       (this,segs,subsector,false,1.79769313486232e+308,&local_78,outVerts);
    iVar14 = OutputDegenerateSubsector
                       (this,segs,subsector,true,-1.79769313486232e+308,&local_78,outVerts);
    local_80 = iVar14 + iVar13 + iVar12 + 1;
  }
  if (local_78->v2 != (int)local_48) {
    pvVar16 = local_68 + local_78->v2;
    pvVar15 = local_68 + local_48;
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(segs,1);
    pgVar8 = segs->Array;
    uVar10 = segs->Count;
    pgVar8[uVar10].super_seg_t.v1 = pvVar16;
    pgVar8[uVar10].super_seg_t.v2 = pvVar15;
    ppsVar2 = &pgVar8[uVar10].super_seg_t.sidedef;
    *ppsVar2 = (side_t *)0x0;
    ppsVar2[1] = (side_t *)0x0;
    ppsVar3 = &pgVar8[uVar10].super_seg_t.frontsector;
    *ppsVar3 = (sector_t *)0x0;
    ppsVar3[1] = (sector_t *)0x0;
    pgVar8[uVar10].Partner = 0xffffffff;
    segs->Count = segs->Count + 1;
    local_80 = local_80 + 1;
  }
  return local_80;
}

Assistant:

int FNodeBuilder::CloseSubsector (TArray<glseg_t> &segs, int subsector, vertex_t *outVerts)
{
	FPrivSeg *seg, *prev;
	angle_t prevAngle;
	double accumx, accumy;
	fixed_t midx, midy;
	int firstVert;
	DWORD first, max, count, i, j;
	bool diffplanes;
	int firstplane;

	first = (DWORD)(size_t)Subsectors[subsector].firstline;
	max = first + Subsectors[subsector].numlines;
	count = 0;

	accumx = accumy = 0.0;
	diffplanes = false;
	firstplane = Segs[SegList[first].SegNum].planenum;

	// Calculate the midpoint of the subsector and also check for degenerate subsectors.
	// A subsector is degenerate if it exists in only one dimension, which can be
	// detected when all the segs lie in the same plane. This can happen if you have
	// outward-facing lines in the void that don't point toward any sector. (Some of the
	// polyobjects in Hexen are constructed like this.)
	for (i = first; i < max; ++i)
	{
		seg = &Segs[SegList[i].SegNum];
		accumx += double(Vertices[seg->v1].x) + double(Vertices[seg->v2].x);
		accumy += double(Vertices[seg->v1].y) + double(Vertices[seg->v2].y);
		if (firstplane != seg->planenum)
		{
			diffplanes = true;
		}
	}

	midx = fixed_t(accumx / (max - first) / 2);
	midy = fixed_t(accumy / (max - first) / 2);

	seg = &Segs[SegList[first].SegNum];
	prevAngle = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
	seg->storedseg = PushGLSeg (segs, seg, outVerts);
	count = 1;
	prev = seg;
	firstVert = seg->v1;

#ifdef DD
	Printf(PRINT_LOG, "--%d--\n", subsector);
	for (j = first; j < max; ++j)
	{
		seg = &Segs[SegList[j].SegNum];
		angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
		Printf(PRINT_LOG, "%d%c %5d(%5d,%5d)->%5d(%5d,%5d) - %3.5f  %d,%d  [%08x,%08x]-[%08x,%08x]\n", j,
			seg->linedef == -1 ? '+' : ':',
			seg->v1, Vertices[seg->v1].x>>16, Vertices[seg->v1].y>>16,
			seg->v2, Vertices[seg->v2].x>>16, Vertices[seg->v2].y>>16,
			double(ang/2)*180/(1<<30),
			seg->planenum, seg->planefront,
			Vertices[seg->v1].x, Vertices[seg->v1].y,
			Vertices[seg->v2].x, Vertices[seg->v2].y);
	}
#endif

	if (diffplanes)
	{ // A well-behaved subsector. Output the segs sorted by the angle formed by connecting
	  // the subsector's center to their first vertex.

		D(Printf(PRINT_LOG, "Well behaved subsector\n"));
		for (i = first + 1; i < max; ++i)
		{
			angle_t bestdiff = ANGLE_MAX;
			FPrivSeg *bestseg = NULL;
			DWORD bestj = DWORD_MAX;
			j = first;
			do
			{
				seg = &Segs[SegList[j].SegNum];
				angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
				angle_t diff = prevAngle - ang;
				if (seg->v1 == prev->v2)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
					break;
				}
				if (diff < bestdiff && diff > 0)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
				}
			}
			while (++j < max);
			// Is a NULL bestseg actually okay?
			if (bestseg != NULL)
			{
				seg = bestseg;
			}
			if (prev->v2 != seg->v1)
			{
				// Add a new miniseg to connect the two segs
				PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[seg->v1]);
				count++;
			}
#ifdef DD
			Printf(PRINT_LOG, "+%d\n", bestj);
#endif
			prevAngle -= bestdiff;
			seg->storedseg = PushGLSeg (segs, seg, outVerts);
			count++;
			prev = seg;
			if (seg->v2 == firstVert)
			{
				prev = seg;
				break;
			}
		}
#ifdef DD
		Printf(PRINT_LOG, "\n");
#endif
	}
	else
	{ // A degenerate subsector. These are handled in three stages:
	  // Stage 1. Proceed in the same direction as the start seg until we
	  //          hit the seg furthest from it.
	  // Stage 2. Reverse direction and proceed until we hit the seg
	  //          furthest from the start seg.
	  // Stage 3. Reverse direction again and insert segs until we get
	  //          to the start seg.
	  // A dot product serves to determine distance from the start seg.

		D(Printf(PRINT_LOG, "degenerate subsector\n"));

		// Stage 1. Go forward.
		count += OutputDegenerateSubsector (segs, subsector, true, 0, prev, outVerts);

		// Stage 2. Go backward.
		count += OutputDegenerateSubsector (segs, subsector, false, DBL_MAX, prev, outVerts);

		// Stage 3. Go forward again.
		count += OutputDegenerateSubsector (segs, subsector, true, -DBL_MAX, prev, outVerts);
	}

	if (prev->v2 != firstVert)
	{
		PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[firstVert]);
		count++;
	}
#ifdef DD
	Printf(PRINT_LOG, "Output GL subsector %d:\n", subsector);
	for (i = segs.Size() - count; i < (int)segs.Size(); ++i)
	{
		Printf(PRINT_LOG, "  Seg %5d%c(%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", i,
			segs[i].linedef == NULL ? '+' : ' ',
			segs[i].v1->fixX()>>16,
			segs[i].v1->fixY()>>16,
			segs[i].v2->fixX()>>16,
			segs[i].v2->fixY()>>16,
			segs[i].v1->fixX(),
			segs[i].v1->fixY(),
			segs[i].v2->fixX(),
			segs[i].v2->fixY());
	}
#endif

	return count;
}